

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PUGIXML_DOMDocument.cpp
# Opt level: O1

DOMNodePtr __thiscall FIX::PUGIXML_DOMNode::getFirstChildNode(PUGIXML_DOMNode *this)

{
  bool bVar1;
  _func_int **pp_Var2;
  long in_RSI;
  xml_node pNode;
  xml_node local_10;
  
  local_10 = pugi::xml_node::first_child((xml_node *)(in_RSI + 8));
  bVar1 = pugi::xml_node::operator!(&local_10);
  if (bVar1) {
    (this->super_DOMNode)._vptr_DOMNode = (_func_int **)0x0;
    pp_Var2 = (_func_int **)0x0;
  }
  else {
    pp_Var2 = (_func_int **)operator_new(0x10);
    *pp_Var2 = (_func_int *)&PTR__DOMNode_001f99a8;
    pp_Var2[1] = (_func_int *)local_10._root;
  }
  (this->super_DOMNode)._vptr_DOMNode = pp_Var2;
  return (__uniq_ptr_data<FIX::DOMNode,_std::default_delete<FIX::DOMNode>,_true,_true>)
         (__uniq_ptr_data<FIX::DOMNode,_std::default_delete<FIX::DOMNode>,_true,_true>)this;
}

Assistant:

DOMNodePtr PUGIXML_DOMNode::getFirstChildNode()
  {
    pugi::xml_node pNode = m_pNode.first_child();
    if( !pNode ) return DOMNodePtr();
    return DOMNodePtr(new PUGIXML_DOMNode(pNode));
  }